

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_util.c
# Opt level: O3

int kvtree_util_get_ptr(kvtree *hash,char *key,void **val)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  void *val_tmp;
  void *local_10;
  
  pcVar3 = kvtree_get_val(hash,key);
  if (pcVar3 == (char *)0x0) {
    iVar2 = 1;
  }
  else {
    iVar1 = __isoc99_sscanf(pcVar3,"%p",&local_10);
    iVar2 = 1;
    if (iVar1 == 1) {
      *val = local_10;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int kvtree_util_get_ptr(const kvtree* hash, const char* key, void** val)
{
  int rc = KVTREE_FAILURE;

  /* check whether this key is even set */
  char* val_str = kvtree_get_val(hash, key);
  if (val_str != NULL) {
    /* convert the key string */
    void* val_tmp;
    int sscanf_rc = sscanf(val_str, "%p", &val_tmp);
    if (sscanf_rc == 1) {
      *val = val_tmp;
      rc = KVTREE_SUCCESS;
    }
  }

  return rc;
}